

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::PickRange::dim_forward(PickRange *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  initializer_list<unsigned_int> x;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  invalid_argument *this_00;
  const_reference this_01;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  size_type in_RSI;
  Dim *in_RDI;
  ostringstream s;
  Dim *in_stack_fffffffffffffde8;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_stack_fffffffffffffdf8;
  ostringstream *this_02;
  undefined8 in_stack_fffffffffffffe08;
  uint b;
  Dim *pDVar5;
  int local_1d4;
  int *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1b9;
  string local_1b8 [48];
  ostringstream local_188 [376];
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  b = (uint)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  pDVar5 = in_RDI;
  local_10 = in_RDX;
  sVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar4 != 1) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0x2d6,"virtual Dim cnn::PickRange::dim_forward(const vector<Dim> &) const");
  }
  std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
  bVar2 = LooksLikeVector(in_stack_fffffffffffffde8);
  if (!bVar2) {
    this_02 = local_188;
    std::__cxx11::ostringstream::ostringstream(this_02);
    std::operator<<((ostream *)this_02,"Bad input dimensions in PickElement: ");
    cnn::operator<<((ostream *)this_02,in_stack_fffffffffffffdf8);
    local_1b9 = 1;
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this_00,local_1b8);
    local_1b9 = 0;
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar1 = *(uint *)(in_RSI + 0x54);
  this_01 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
  uVar3 = Dim::operator[](this_01,0);
  if (uVar1 <= uVar3) {
    local_1d4 = *(int *)(in_RSI + 0x54) - *(int *)(in_RSI + 0x50);
    local_1d0 = &local_1d4;
    local_1c8 = 1;
    std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
    x._M_len = in_RSI;
    x._M_array = pDVar5->d;
    Dim::Dim(in_RDI,x,b);
    return pDVar5;
  }
  __assert_fail("end <= xs[0][0]",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                ,0x2db,"virtual Dim cnn::PickRange::dim_forward(const vector<Dim> &) const");
}

Assistant:

Dim PickRange::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() == 1);
  if (!LooksLikeVector(xs[0])) {
    ostringstream s; s << "Bad input dimensions in PickElement: " << xs;
    throw std::invalid_argument(s.str());
  }
  assert(end <= xs[0][0]);
  return Dim({end - start}, xs[0].bd);
}